

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  string *psVar1;
  size_t *this_00;
  pointer *X_base;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ParameterSet *pPVar10;
  pointer pVVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  BaseHandle BVar15;
  bool bVar16;
  int iVar17;
  Index IVar18;
  Index IVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  uint uVar23;
  char *pcVar24;
  MeshDenoisingBase *pMVar25;
  pointer *this_01;
  ulong uVar26;
  size_t *psVar27;
  long lVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  FaceIter FVar34;
  undefined1 local_590 [8];
  SparseMatrix<double,_0,_int> weight_matrix;
  SparseMatrix<double,_0,_int> normalize_matrix;
  SparseMatrix<double,_0,_int> identity_matrix;
  SparseMatrix<double,_0,_int> coef_matrix;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  undefined1 local_280 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 auStack_1b8 [8];
  SparseMatrix<double,_0,_int> matrix;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  MatrixX3d filtered_normals_matrix;
  int local_11c;
  int local_118;
  int face_neighbor_index;
  int vertex_iteration_number;
  double smoothness;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_100;
  undefined1 auStack_f8 [8];
  MatrixXd right_term;
  CompressedStorage<double,_int> local_d0;
  Triplet<double,_int> *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  pointer pTStack_98;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> coef_triple;
  pointer pTStack_78;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> weight_triple;
  double local_58;
  int local_4c;
  Index *pIStack_48;
  int normal_iteration_number;
  MeshDenoisingBase *local_40;
  bool local_31 [8];
  bool include_central_face;
  
  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x28))(mesh);
  local_100 = filtered_normals;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar17);
  pPVar10 = (this->super_MeshDenoisingBase).parameter_set_;
  psVar1 = &solver.m_lastError;
  coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
  local_40 = &this->super_MeshDenoisingBase;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&coef_matrix.m_data.m_allocatedSize,"Face Neighbor","");
  bVar16 = ParameterSet::getValue(pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,&local_11c);
  if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
    operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
  }
  if (bVar16) {
    pPVar10 = local_40->parameter_set_;
    coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&coef_matrix.m_data.m_allocatedSize,"include central face","");
    bVar16 = ParameterSet::getValue(pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,local_31);
    if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
      operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
    }
    if (bVar16) {
      pPVar10 = local_40->parameter_set_;
      coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&coef_matrix.m_data.m_allocatedSize,"Multiple(* avg face dis.)","");
      bVar16 = ParameterSet::getValue
                         (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,
                          (double *)
                          &all_guided_neighbor.
                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
        operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
      }
      if (bVar16) {
        pPVar10 = local_40->parameter_set_;
        coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&coef_matrix.m_data.m_allocatedSize,"Multiple(* sigma_s)","");
        bVar16 = ParameterSet::getValue
                           (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,&multiple_radius);
        if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
          operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
        }
        if (bVar16) {
          pPVar10 = local_40->parameter_set_;
          coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&coef_matrix.m_data.m_allocatedSize,"(Global)Normal Iteration Num.",
                     "");
          bVar16 = ParameterSet::getValue
                             (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,&local_4c);
          if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
            operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
          }
          if (bVar16) {
            pPVar10 = local_40->parameter_set_;
            coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&coef_matrix.m_data.m_allocatedSize,"sigma_r","");
            bVar16 = ParameterSet::getValue
                               (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,
                                &multiple_sigma_s);
            if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
              operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
            }
            if (bVar16) {
              pPVar10 = local_40->parameter_set_;
              coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&coef_matrix.m_data.m_allocatedSize,"smoothness","");
              bVar16 = ParameterSet::getValue
                                 (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,
                                  (double *)&vertex_iteration_number);
              if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
                operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
              }
              if (bVar16) {
                pPVar10 = local_40->parameter_set_;
                coef_matrix.m_data.m_allocatedSize = (size_t)psVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&coef_matrix.m_data.m_allocatedSize,"Vertex Iteration Num.","")
                ;
                bVar16 = ParameterSet::getValue
                                   (pPVar10,(string *)&coef_matrix.m_data.m_allocatedSize,&local_118
                                   );
                if ((string *)coef_matrix.m_data.m_allocatedSize != psVar1) {
                  operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
                }
                if (bVar16) {
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  pTStack_98 = (pointer)0x0;
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  pTStack_78 = (pointer)0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar19 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590,IVar18,IVar19);
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar19 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize,
                             IVar18,IVar19);
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar19 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize,IVar18,IVar19);
                  Eigen::SparseMatrix<double,_0,_int>::setIdentity
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize);
                  if (local_11c == 0) {
                    pIStack_48 = (Index *)getRadius((GuidedMeshNormalFiltering *)local_40,
                                                    (double)all_guided_neighbor.
                                                                                                                        
                                                  super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,mesh);
                  }
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_280,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  getAllFaceNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,mesh,(uint)(local_11c == 0) * 2,
                             (double)pIStack_48,local_31[0],
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)local_280);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&all_face_neighbor.
                               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  pMVar25 = local_40;
                  getAllGuidedNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,mesh,
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)&all_face_neighbor.
                                 super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  MeshDenoisingBase::getFaceNormal(pMVar25,mesh,local_100);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)&sigma_r,(long)iVar17,
                             (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&matrix.m_data.m_allocatedSize,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&face_centroid.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&solver.m_detPermR,(long)iVar17,
                           (allocator_type *)&coef_matrix.m_data.m_allocatedSize);
                  if (0 < local_4c) {
                    iVar17 = 0;
                    do {
                      psVar27 = &matrix.m_data.m_allocatedSize;
                      pMVar25 = local_40;
                      face_neighbor_index = iVar17;
                      MeshDenoisingBase::getFaceCentroid
                                (local_40,mesh,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)psVar27);
                      smoothness = getSigmaS((GuidedMeshNormalFiltering *)pMVar25,multiple_radius,
                                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)psVar27,mesh);
                      MeshDenoisingBase::getFaceArea
                                (local_40,mesh,(vector<double,_std::allocator<double>_> *)&sigma_r);
                      MeshDenoisingBase::getFaceNormal
                                (local_40,mesh,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&face_centroid.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      this_01 = &range_and_mean_normal.
                                 super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      std::
                      vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                      ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                *)this_01,
                               (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                *)&solver.m_detPermR);
                      getGuidedNormals((GuidedMeshNormalFiltering *)this_01,mesh,
                                       (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                        *)&all_face_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<double,_std::allocator<double>_> *)&sigma_r,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)&face_centroid.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                        *)&range_and_mean_normal.
                                           super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)&face_area.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (range_and_mean_normal.
                          super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                        operator_delete(range_and_mean_normal.
                                        super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      if (coef_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != pTStack_98) {
                        coef_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = pTStack_98;
                      }
                      if (weight_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != pTStack_78) {
                        weight_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = pTStack_78;
                      }
                      FVar34 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
                      auStack_f8[0] = FVar34.mesh_._0_1_;
                      auStack_f8._1_7_ = FVar34.mesh_._1_7_;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ = (int)FVar34.hnd_.super_BaseHandle.idx_;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = FVar34.skip_bits_;
                      smoothness = smoothness * smoothness;
                      while( true ) {
                        psVar27 = &weight_matrix.m_data.m_allocatedSize;
                        FVar34 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                        BVar15.idx_ = right_term.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_data._0_4_;
                        if ((BaseHandle)
                            right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data._0_4_ ==
                            FVar34.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
                            (mesh_ptr)CONCAT71(auStack_f8._1_7_,auStack_f8[0]) == FVar34.mesh_)
                        break;
                        lVar20 = (long)right_term.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_data._0_4_;
                        lVar29 = lVar20 * 0x18;
                        dVar2 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3];
                        dVar3 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3 + 1];
                        dVar4 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3 + 2];
                        dVar5 = *(double *)(matrix.m_data.m_allocatedSize + lVar29);
                        dVar6 = *(double *)(matrix.m_data.m_allocatedSize + 8 + lVar29);
                        dVar7 = *(double *)(matrix.m_data.m_allocatedSize + 0x10 + lVar29);
                        std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                        vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)&coef_matrix.m_data.m_allocatedSize,
                               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)((long)local_280 + lVar20 * 0x18));
                        if ((int)(CONCAT44(solver._4_4_,solver.m_info) -
                                  coef_matrix.m_data.m_allocatedSize >> 2) < 1) {
                          local_58 = 0.0;
                        }
                        else {
                          local_58 = 0.0;
                          lVar29 = 0;
                          do {
                            iVar17 = *(int *)(coef_matrix.m_data.m_allocatedSize + lVar29 * 4);
                            lVar28 = (long)iVar17;
                            lVar20 = lVar28 * 0x18;
                            dVar32 = dVar5 - *(double *)(matrix.m_data.m_allocatedSize + lVar20);
                            dVar33 = dVar6 - *(double *)(matrix.m_data.m_allocatedSize + 8 + lVar20)
                            ;
                            dVar30 = dVar7 - *(double *)
                                              (matrix.m_data.m_allocatedSize + 0x10 + lVar20);
                            dVar31 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage[lVar28 * 3];
                            dVar8 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage
                                    [lVar28 * 3 + 1];
                            dVar9 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage
                                    [lVar28 * 3 + 2];
                            dVar30 = dVar30 * dVar30 + dVar32 * dVar32 + dVar33 * dVar33;
                            if (dVar30 < 0.0) {
                              dVar30 = sqrt(dVar30);
                            }
                            else {
                              dVar30 = SQRT(dVar30);
                            }
                            pIStack_48 = (Index *)exp((dVar30 * -0.5 * dVar30) / smoothness);
                            dVar31 = (dVar4 - dVar9) * (dVar4 - dVar9) +
                                     (dVar2 - dVar31) * (dVar2 - dVar31) +
                                     (dVar3 - dVar8) * (dVar3 - dVar8);
                            if (dVar31 < 0.0) {
                              dVar31 = sqrt(dVar31);
                            }
                            else {
                              dVar31 = SQRT(dVar31);
                            }
                            dVar31 = exp((dVar31 * -0.5 * dVar31) /
                                         (multiple_sigma_s * multiple_sigma_s));
                            pIStack_48 = (Index *)((double)pIStack_48 *
                                                   *(double *)((long)sigma_r + lVar28 * 8) * dVar31)
                            ;
                            auStack_1b8._0_4_ = BVar15.idx_;
                            auStack_1b8._4_4_ = iVar17;
                            matrix._0_8_ = pIStack_48;
                            if (coef_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start ==
                                coef_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) {
                              std::
                              vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                              ::_M_realloc_insert<Eigen::Triplet<double,int>>
                                        ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                          *)&pTStack_98,
                                         (iterator)
                                         coef_triple.
                                         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                         (Triplet<double,_int> *)auStack_1b8);
                            }
                            else {
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_row = BVar15.idx_;
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_col = iVar17;
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_value =
                                   (double)pIStack_48;
                              coef_triple.
                              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1;
                            }
                            local_58 = local_58 + (double)pIStack_48;
                            lVar29 = lVar29 + 1;
                          } while (lVar29 < (int)(CONCAT44(solver._4_4_,solver.m_info) -
                                                  coef_matrix.m_data.m_allocatedSize >> 2));
                        }
                        matrix._0_8_ = 1.0 / local_58;
                        auStack_1b8._0_4_ = BVar15.idx_;
                        auStack_1b8._4_4_ = BVar15.idx_;
                        if (weight_triple.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            weight_triple.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::
                          vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                          ::_M_realloc_insert<Eigen::Triplet<double,int>>
                                    ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                      *)&pTStack_78,
                                     (iterator)
                                     weight_triple.
                                     super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (Triplet<double,_int> *)auStack_1b8);
                        }
                        else {
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_row = BVar15.idx_;
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_col = BVar15.idx_;
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_value =
                               (double)matrix._0_8_;
                          weight_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               weight_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                        }
                        if (coef_matrix.m_data.m_allocatedSize != 0) {
                          operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
                        }
                        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data._0_4_ =
                             right_term.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data._0_4_ + 1;
                        if (right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data._4_4_ != 0) {
                          OpenMesh::Iterators::
                          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                      *)auStack_f8);
                        }
                      }
                      coef_matrix.m_data.m_allocatedSize = (size_t)pTStack_98;
                      auStack_f8[0] =
                           SUB81(coef_triple.
                                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0);
                      auStack_f8._1_7_ =
                           (undefined7)
                           ((ulong)coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 8);
                      this_00 = &coef_matrix.m_data.m_allocatedSize;
                      Eigen::internal::
                      set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
                                ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)this_00,
                                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)auStack_f8,(SparseMatrix<double,_0,_int> *)local_590,0);
                      coef_matrix.m_data.m_allocatedSize = (size_t)pTStack_78;
                      auStack_f8[0] =
                           SUB81(weight_triple.
                                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0);
                      auStack_f8._1_7_ =
                           (undefined7)
                           ((ulong)weight_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 8);
                      Eigen::internal::
                      set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
                                ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)this_00,
                                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)auStack_f8,(SparseMatrix<double,_0,_int> *)psVar27,0);
                      auStack_f8[0] =
                           (SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                            )0x0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows = (DenseIndex)local_590;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols = 0;
                      if (weight_matrix.m_data.m_allocatedSize._4_4_ != weight_matrix._0_4_) {
                        pcVar24 = 
                        "void Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>::init() [Lhs = const Eigen::SparseMatrix<double> &, Rhs = const Eigen::SparseMatrix<double> &]"
                        ;
LAB_0015e665:
                        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data = (double *)psVar27;
                        __assert_fail("m_lhs.cols() == m_rhs.rows()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseProduct.h"
                                      ,0x85,pcVar24);
                      }
                      coef_matrix.m_data.m_allocatedSize =
                           coef_matrix.m_data.m_allocatedSize & 0xffffffffffffff00;
                      solver._0_8_ = &normalize_matrix.m_data.m_allocatedSize;
                      solver.m_lastError._M_dataplus._M_p._0_4_ =
                           (uint)solver.m_lastError._M_dataplus._M_p & 0xffffff00;
                      solver.m_lastError._M_dataplus._M_p._4_4_ = 0;
                      solver.m_lastError._M_string_length._0_4_ = 0;
                      solver.m_mat.m_outerIndex = (Index *)0x0;
                      solver.m_mat.m_innerNonZeros = (Index *)0x0;
                      solver.m_mat.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                      m_isRValue = false;
                      solver.m_mat._1_3_ = 0;
                      solver.m_mat.m_outerSize = 0;
                      solver.m_mat.m_innerSize = 0;
                      solver.m_mat._12_4_ = 0;
                      solver.m_lastError.field_2._M_allocated_capacity = 0;
                      solver.m_lastError.field_2._8_8_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data = (double *)psVar27;
                      Eigen::
                      SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                      ::evalTo<Eigen::SparseMatrix<double,0,int>>
                                ((SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                                  *)auStack_f8,(SparseMatrix<double,_0,_int> *)&solver.m_lastError);
                      if ((identity_matrix._0_4_ !=
                           *(int *)(right_term.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data + 1)) ||
                         (normalize_matrix.m_data.m_allocatedSize._4_4_ !=
                          *(int *)(right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows + 4))) {
                        pcVar24 = 
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::SparseMatrix<double>, const Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::SparseMatrix<double>, Rhs = const Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>]"
                        ;
LAB_0015e62f:
                        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseBinaryOp.h"
                                      ,0x83,pcVar24);
                      }
                      auStack_1b8._0_4_ = auStack_1b8._0_4_ & 0xffffff00;
                      auStack_1b8._4_4_ = 0;
                      matrix.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue
                           = false;
                      matrix._1_3_ = 0;
                      matrix.m_data.m_indices = (Index *)0x0;
                      matrix.m_data.m_size = 0;
                      matrix.m_innerNonZeros = (Index *)0x0;
                      matrix.m_data.m_values = (Scalar_conflict *)0x0;
                      matrix.m_innerSize = 0;
                      matrix._12_4_ = 0;
                      matrix.m_outerIndex = (Index *)0x0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)auStack_1b8,
                                 (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>_>
                                  *)this_00);
                      free((void *)solver.m_lastError.field_2._M_allocated_capacity);
                      free((void *)solver.m_lastError.field_2._8_8_);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&solver.m_mat);
                      previous_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)((ulong)previous_normals.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                    0xffffffffffffff00);
                      auStack_f8[0] =
                           (SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                            )0x0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ =
                           right_term.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data._0_4_ & 0xffffff00;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._0_4_ = 0;
                      local_d0.m_size = 0;
                      local_d0.m_allocatedSize = 0;
                      local_d0.m_values = (Scalar_conflict *)0x0;
                      local_d0.m_indices = (Index *)0x0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols = 0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)&right_term,
                                 (SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Transpose<Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                  *)&previous_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      uVar12._4_4_ = matrix.m_outerSize;
                      uVar12._0_1_ = matrix.
                                     super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                                     m_isRValue;
                      uVar12._1_3_ = matrix._1_3_;
                      psVar27 = (size_t *)
                                CONCAT44(right_term.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data._4_4_,
                                         right_term.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data._0_4_);
                      local_a8 = 0;
                      local_a0 = 1;
                      local_b0 = (Triplet<double,_int> *)auStack_1b8;
                      if (right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data._4_4_ != matrix._0_4_) {
                        pcVar24 = 
                        "void Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>::init() [Lhs = Eigen::SparseMatrix<double>, Rhs = const Eigen::SparseMatrix<double> &]"
                        ;
                        matrix._0_8_ = uVar12;
                        goto LAB_0015e665;
                      }
                      pIStack_48 = _vertex_iteration_number;
                      coef_matrix.m_data.m_allocatedSize =
                           coef_matrix.m_data.m_allocatedSize & 0xffffffffffffff00;
                      solver.m_info = solver.m_info & 0xffffff00;
                      solver.m_isInitialized = false;
                      solver.m_factorizationIsOk = false;
                      solver.m_analysisIsOk = false;
                      solver._7_1_ = 0;
                      solver.m_lastError._M_dataplus._M_p._0_4_ = 0;
                      solver.m_mat.m_innerSize = 0;
                      solver.m_mat._12_4_ = 0;
                      solver.m_mat.m_outerIndex = (Index *)0x0;
                      solver.m_lastError.field_2._8_8_ = 0;
                      solver.m_mat.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                      m_isRValue = false;
                      solver.m_mat._1_3_ = 0;
                      solver.m_mat.m_outerSize = 0;
                      solver.m_lastError._M_string_length._0_4_ = 0;
                      solver.m_lastError._M_string_length._4_4_ = 0;
                      solver.m_lastError.field_2._M_allocated_capacity = 0;
                      Eigen::
                      SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                      ::evalTo<Eigen::SparseMatrix<double,0,int>>
                                ((SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                                  *)auStack_f8,(SparseMatrix<double,_0,_int> *)&solver);
                      uVar14._4_4_ = matrix.m_outerSize;
                      uVar14._0_1_ = matrix.
                                     super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                                     m_isRValue;
                      uVar14._1_3_ = matrix._1_3_;
                      uVar13._4_1_ = solver.m_isInitialized;
                      uVar13._5_1_ = solver.m_factorizationIsOk;
                      uVar13._6_1_ = solver.m_analysisIsOk;
                      uVar13._7_1_ = solver._7_1_;
                      uVar13._0_4_ = solver.m_info;
                      solver.m_mat.m_innerNonZeros =
                           (Index *)((ulong)solver.m_mat.m_innerNonZeros & 0xffffffffffffff00);
                      solver.m_mat.m_data.m_values =
                           (Scalar_conflict *)&normalize_matrix.m_data.m_allocatedSize;
                      solver.m_mat.m_data.m_indices = pIStack_48;
                      if (((int)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows != identity_matrix._0_4_) ||
                         (local_b0->m_col != normalize_matrix.m_data.m_allocatedSize._4_4_)) {
                        pcVar24 = 
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::SparseMatrix<double>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::SparseMatrix<double>>]"
                        ;
                        solver._0_8_ = uVar13;
                        matrix._0_8_ = uVar14;
                        goto LAB_0015e62f;
                      }
                      identity_matrix.m_data.m_allocatedSize._0_1_ = 0;
                      stack0xfffffffffffffb34 = 0;
                      coef_matrix.m_data.m_indices = (Index *)0x0;
                      coef_matrix.m_data.m_size = 0;
                      coef_matrix.m_innerNonZeros = (Index *)0x0;
                      coef_matrix.m_data.m_values = (Scalar_conflict *)0x0;
                      coef_matrix.m_innerSize = 0;
                      coef_matrix._12_4_ = 0;
                      coef_matrix.m_outerIndex = (Index *)0x0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)
                                 &identity_matrix.m_data.m_allocatedSize,
                                 (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                  *)this_00);
                      free((void *)CONCAT44(solver.m_lastError._M_string_length._4_4_,
                                            (undefined4)solver.m_lastError._M_string_length));
                      free((void *)solver.m_lastError.field_2._M_allocated_capacity);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)
                                 ((long)&solver.m_lastError.field_2 + 8));
                      free((void *)right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols);
                      free((void *)0x0);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_d0)
                      ;
                      iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                                                                            
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                           + 0x28))(mesh);
                      auStack_f8[0] =
                           (SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                            )0x0;
                      auStack_f8._1_7_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._0_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._4_4_ = 0;
                      lVar29 = (long)iVar17;
                      if (lVar29 < 0) {
                        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                                      ,0xf1,
                                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                ((DenseStorage<double,__1,__1,__1,_0> *)auStack_f8,lVar29 * 3,lVar29
                                 ,3);
                      uVar23 = (int)((long)previous_normals.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)face_centroid.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)
                               * -0x55555555;
                      if (0 < (int)uVar23) {
                        lVar29 = CONCAT71(auStack_f8._1_7_,auStack_f8[0]);
                        lVar20 = CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data._4_4_,
                                          right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data._0_4_);
                        lVar28 = CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_rows._4_4_,
                                          (int)right_term.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_rows);
                        pdVar21 = ((face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super_VectorDataT<double,_3>).values_ + 2;
                        uVar26 = 0;
                        do {
                          if ((((lVar20 <= (long)uVar26) || (lVar28 < 1)) ||
                              (*(double *)(lVar29 + uVar26 * 8) =
                                    ((VectorDataT<double,_3> *)(pdVar21 + -2))->values_[0],
                              lVar28 == 1)) ||
                             (*(double *)(lVar29 + lVar20 * 8 + uVar26 * 8) = pdVar21[-1],
                             lVar28 < 3)) {
                            pcVar24 = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                            ;
                            goto LAB_0015e5f9;
                          }
                          *(double *)(lVar20 * 0x10 + lVar29 + uVar26 * 8) = *pdVar21;
                          uVar26 = uVar26 + 1;
                          pdVar21 = pdVar21 + 3;
                        } while ((uVar23 & 0x7fffffff) != uVar26);
                      }
                      coef_matrix.m_data.m_allocatedSize = (size_t)auStack_f8;
                      solver.m_info = (ComputationInfo)_vertex_iteration_number;
                      solver._4_4_ = SUB84((ulong)_vertex_iteration_number >> 0x20,0);
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                      lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                                 coef_matrix.m_data.m_allocatedSize,
                                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  *)this_00);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                *)this_00);
                      psVar27 = &identity_matrix.m_data.m_allocatedSize;
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                      *)this_00,(MatrixType *)psVar27);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      factorize((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                 *)this_00,(MatrixType *)psVar27);
                      if (coef_matrix.m_data.m_allocatedSize._5_1_ == '\0') {
                        __assert_fail("m_factorizationIsOk && \"SparseLU is not initialized.\"",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                                      ,0xb4,
                                      "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      if (CONCAT44(right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data._4_4_,
                                   right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data._0_4_) != (long)(int)solver.m_mat._0_4_) {
                        __assert_fail("rows()==B.rows() && \"SparseLU::solve(): invalid number of rows of the right hand side matrix B\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                                      ,0xb6,
                                      "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      previous_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      X_base = &previous_normals.
                                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
                                ((PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)X_base,
                                 (long)(int)solver.m_lastError.field_2._12_4_,
                                 CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_rows._4_4_,
                                          (int)right_term.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_rows));
                      Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                      ::
                      _solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,3,0,_1,3>>
                                ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                                  *)this_00,
                                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auStack_f8
                                 ,(MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)X_base);
                      guided_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)X_base;
                      Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
                                ((VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)
                                 &guided_normals.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      pVVar11 = (local_100->
                                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      uVar23 = (int)((long)(local_100->
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pVVar11 >> 3) * -0x55555555;
                      if (0 < (int)uVar23) {
                        pdVar22 = (pVVar11->super_VectorDataT<double,_3>).values_ + 2;
                        lVar29 = 0;
                        pdVar21 = (double *)
                                  previous_normals.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        do {
                          if (lVar29 == 0) {
                            pcVar24 = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 3>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 3>, Level = 1]"
                            ;
LAB_0015e5f9:
                            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                                          ,0x151,pcVar24);
                          }
                          ((VectorDataT<double,_3> *)(pdVar22 + -2))->values_[0] = *pdVar21;
                          pdVar22[-1] = *pdVar21;
                          *pdVar22 = *pdVar21;
                          lVar29 = lVar29 + -1;
                          pdVar21 = pdVar21 + 1;
                          pdVar22 = pdVar22 + 3;
                        } while (-lVar29 != (ulong)(uVar23 & 0x7fffffff));
                      }
                      MeshDenoisingBase::updateVertexPosition
                                (local_40,mesh,local_100,local_118,false);
                      iVar17 = face_neighbor_index;
                      free(previous_normals.
                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      ~SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                 *)this_00);
                      free((void *)CONCAT71(auStack_f8._1_7_,auStack_f8[0]));
                      free((void *)coef_matrix._8_8_);
                      free(coef_matrix.m_outerIndex);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&coef_matrix.m_innerNonZeros);
                      free((void *)matrix._8_8_);
                      free(matrix.m_outerIndex);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&matrix.m_innerNonZeros);
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < local_4c);
                  }
                  if (solver._472_8_ != 0) {
                    operator_delete((void *)solver._472_8_);
                  }
                  if (face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    operator_delete(face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  if (face_centroid.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    operator_delete(face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  if (matrix.m_data.m_allocatedSize != 0) {
                    operator_delete((void *)matrix.m_data.m_allocatedSize);
                  }
                  if (sigma_r != 0.0) {
                    operator_delete((void *)sigma_r);
                  }
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)&all_face_neighbor.
                                super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)local_280);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590);
                  if (pTStack_78 != (pointer)0x0) {
                    operator_delete(pTStack_78);
                  }
                  if (pTStack_98 != (pointer)0x0) {
                    operator_delete(pTStack_98);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Global)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    double smoothness;
    if(!parameter_set_->getValue(string("smoothness"), smoothness))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    std::vector< Eigen::Triplet<double> > coef_triple;
    std::vector< Eigen::Triplet<double> > weight_triple;
    Eigen::SparseMatrix<double> weight_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> normalize_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> identity_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    identity_matrix.setIdentity();

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // construct matrix
        coef_triple.clear();
        weight_triple.clear();

        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = guided_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];            
            double weight_sum = 0.0;
            for(int i = 0; i < (int)face_neighbor.size(); i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = guided_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];
                double spatial_weight = GaussianWeight((ci - cj).length(), sigma_s);
                double range_weight = GaussianWeight((ni - nj).length(), sigma_r);
                double weight = face_area[index_j] * spatial_weight * range_weight;
                coef_triple.push_back( Eigen::Triplet<double>(index_i, index_j, weight) );
                weight_sum += weight;
            }
            weight_triple.push_back( Eigen::Triplet<double>(index_i, index_i , 1.0 / weight_sum) );
        }
        weight_matrix.setFromTriplets(coef_triple.begin(), coef_triple.end());
        normalize_matrix.setFromTriplets(weight_triple.begin(), weight_triple.end());
        Eigen::SparseMatrix<double> matrix = identity_matrix - normalize_matrix * weight_matrix;
        Eigen::SparseMatrix<double> coef_matrix = (1 - smoothness) * matrix.transpose() * matrix + smoothness * identity_matrix;

        // construct right term
        Eigen::MatrixXd right_term((int)mesh.n_faces(), 3);
        for(int i = 0; i < (int)previous_normals.size(); i++)
        {
            right_term(i, 0) = previous_normals[i][0];
            right_term(i, 1) = previous_normals[i][1];
            right_term(i, 2) = previous_normals[i][2];
        }
        right_term = smoothness * right_term;

        // solve Ax = b
        Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
        solver.analyzePattern(coef_matrix);
        solver.factorize(coef_matrix);
        Eigen::MatrixX3d filtered_normals_matrix = solver.solve(right_term);
        filtered_normals_matrix.rowwise().normalize();
        for(int i = 0; i < (int)filtered_normals.size(); i++)
        {
            filtered_normals[i][0] = filtered_normals_matrix(i, 0);
            filtered_normals[i][1] = filtered_normals_matrix(i, 1);
            filtered_normals[i][2] = filtered_normals_matrix(i, 2);
        }
        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}